

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O0

size_t muduo::detail::convert<unsigned_long>(char *buf,unsigned_long value)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  undefined1 *puVar3;
  char *in_RSI;
  undefined1 *in_RDI;
  int lsd;
  char *p;
  unsigned_long i;
  undefined1 *local_20;
  
  local_20 = in_RDI;
  pcVar2 = in_RSI;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pcVar2;
    pcVar2 = (char *)((ulong)pcVar2 / 10);
    puVar3 = local_20 + 1;
    *local_20 = *(undefined1 *)(zero + SUB164(auVar1 % ZEXT816(10),0));
    local_20 = puVar3;
  } while (pcVar2 != (char *)0x0);
  *puVar3 = 0;
  std::reverse<char*>(in_RSI,(char *)0x0);
  return (long)puVar3 - (long)in_RDI;
}

Assistant:

size_t convert(char buf[], T value)
{
  T i = value;
  char* p = buf;

  do
  {
    int lsd = static_cast<int>(i % 10);
    i /= 10;
    *p++ = zero[lsd];
  } while (i != 0);

  if (value < 0)
  {
    *p++ = '-';
  }
  *p = '\0';
  std::reverse(buf, p);

  return p - buf;
}